

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerHLSL::analyze_meshlet_writes(CompilerHLSL *this)

{
  uint id;
  uint32_t uVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  StorageClass SVar5;
  SPIRVariable *var;
  SPIRType *pSVar6;
  Bitset *pBVar7;
  byte bVar8;
  long lVar9;
  uint32_t local_e8;
  uint32_t local_e4;
  LoopLock local_d0;
  ParsedIR *local_c8;
  TypedID<(spirv_cross::Types)0> *local_c0;
  long local_b8;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  processed_func_ids;
  __node_base_ptr local_78;
  anon_class_8_1_8991fb9c generate_block;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_c8 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(local_c8);
  local_c0 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  local_b8 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size << 2;
  lVar9 = 0;
  local_e4 = 0;
  local_e8 = 0;
  bVar8 = 0;
  bVar2 = 0;
  do {
    if (local_b8 == lVar9) {
      ParsedIR::LoopLock::~LoopLock(&local_d0);
      generate_block.this = this;
      if ((bool)(local_e8 == 0 & bVar2)) {
        local_e8 = analyze_meshlet_writes::anon_class_8_1_8991fb9c::operator()
                             (&generate_block,"gl_MeshPerVertexEXT","gl_MeshVerticesEXT",false);
      }
      if ((local_e4 == 0 & bVar8) == 1) {
        local_e4 = analyze_meshlet_writes::anon_class_8_1_8991fb9c::operator()
                             (&generate_block,"gl_MeshPerPrimitiveEXT","gl_MeshPrimitivesEXT",true);
      }
      processed_func_ids._M_h._M_buckets = &processed_func_ids._M_h._M_single_bucket;
      processed_func_ids._M_h._M_bucket_count = 1;
      processed_func_ids._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processed_func_ids._M_h._M_element_count = 0;
      processed_func_ids._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      processed_func_ids._M_h._M_rehash_policy._M_next_resize = 0;
      processed_func_ids._M_h._M_single_bucket = (__node_base_ptr)0x0;
      analyze_meshlet_writes
                (this,(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id,local_e8,
                 local_e4,&processed_func_ids);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&processed_func_ids._M_h);
      return;
    }
    id = *(uint *)((long)&local_c0->id + lVar9);
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [id].type == TypeVariable) {
      var = ParsedIR::get<spirv_cross::SPIRVariable>(local_c8,id);
      pSVar6 = Compiler::get<spirv_cross::SPIRType>
                         ((Compiler *)this,*(uint32_t *)&(var->super_IVariant).field_0xc);
      bVar3 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(pSVar6->super_IVariant).self.id,DecorationBlock);
      SVar5 = var->storage;
      if (bVar3 && SVar5 == StorageClassOutput) {
        bVar4 = Compiler::is_builtin_variable((Compiler *)this,var);
        if (!bVar4) {
          SVar5 = var->storage;
          goto LAB_00192763;
        }
        Compiler::get_buffer_block_flags
                  ((Bitset *)&processed_func_ids,(Compiler *)this,
                   (VariableID)(var->super_IVariant).self.id);
        bVar3 = Bitset::get((Bitset *)&processed_func_ids,0x1497);
        uVar1 = (var->super_IVariant).self.id;
        if (!bVar3) {
          local_e8 = uVar1;
          uVar1 = local_e4;
        }
      }
      else {
LAB_00192763:
        if (SVar5 != StorageClassOutput) goto LAB_00192820;
        processed_func_ids._M_h._M_buckets = (__buckets_ptr)0x0;
        processed_func_ids._M_h._M_bucket_count = (size_type)&local_78;
        processed_func_ids._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x1;
        processed_func_ids._M_h._M_element_count = 0;
        processed_func_ids._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        processed_func_ids._M_h._M_rehash_policy._4_4_ = 0;
        processed_func_ids._M_h._M_rehash_policy._M_next_resize =
             CONCAT44(processed_func_ids._M_h._M_rehash_policy._M_next_resize._4_4_,0x3f800000);
        processed_func_ids._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_78 = (__node_base_ptr)0x0;
        if (bVar3) {
          Compiler::get_buffer_block_flags
                    ((Bitset *)&generate_block,(Compiler *)this,
                     (VariableID)(var->super_IVariant).self.id);
          Bitset::operator=((Bitset *)&processed_func_ids,(Bitset *)&generate_block);
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_68);
        }
        else {
          pBVar7 = Compiler::get_decoration_bitset
                             ((Compiler *)this,(ID)(var->super_IVariant).self.id);
          Bitset::operator=((Bitset *)&processed_func_ids,pBVar7);
        }
        bVar3 = Bitset::get((Bitset *)&processed_func_ids,0x1497);
        bVar8 = bVar8 | bVar3;
        bVar2 = bVar2 | !bVar3;
        uVar1 = local_e4;
      }
      local_e4 = uVar1;
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&processed_func_ids._M_h._M_bucket_count);
    }
LAB_00192820:
    lVar9 = lVar9 + 4;
  } while( true );
}

Assistant:

void CompilerHLSL::analyze_meshlet_writes()
{
	uint32_t id_per_vertex = 0;
	uint32_t id_per_primitive = 0;
	bool need_per_primitive = false;
	bool need_per_vertex = false;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);
		if (var.storage == StorageClassOutput && block && is_builtin_variable(var))
		{
			auto flags = get_buffer_block_flags(var.self);
			if (flags.get(DecorationPerPrimitiveEXT))
				id_per_primitive = var.self;
			else
				id_per_vertex = var.self;
		}
		else if (var.storage == StorageClassOutput)
		{
			Bitset flags;
			if (block)
				flags = get_buffer_block_flags(var.self);
			else
				flags = get_decoration_bitset(var.self);

			if (flags.get(DecorationPerPrimitiveEXT))
				need_per_primitive = true;
			else
				need_per_vertex = true;
		}
	});

	// If we have per-primitive outputs, and no per-primitive builtins,
	// empty version of gl_MeshPerPrimitiveEXT will be emitted.
	// If we don't use block IO for vertex output, we'll also need to synthesize the PerVertex block.

	const auto generate_block = [&](const char *block_name, const char *instance_name, bool per_primitive) -> uint32_t {
		auto &execution = get_entry_point();

		uint32_t op_type = ir.increase_bound_by(4);
		uint32_t op_arr = op_type + 1;
		uint32_t op_ptr = op_type + 2;
		uint32_t op_var = op_type + 3;

		auto &type = set<SPIRType>(op_type, OpTypeStruct);
		type.basetype = SPIRType::Struct;
		set_name(op_type, block_name);
		set_decoration(op_type, DecorationBlock);
		if (per_primitive)
			set_decoration(op_type, DecorationPerPrimitiveEXT);

		auto &arr = set<SPIRType>(op_arr, type);
		arr.op = OpTypeArray;
		arr.parent_type = type.self;
		arr.array.push_back(per_primitive ? execution.output_primitives : execution.output_vertices);
		arr.array_size_literal.push_back(true);

		auto &ptr = set<SPIRType>(op_ptr, arr);
		ptr.parent_type = arr.self;
		ptr.op = OpTypePointer;
		ptr.pointer = true;
		ptr.pointer_depth++;
		ptr.storage = StorageClassOutput;
		set_decoration(op_ptr, DecorationBlock);
		set_name(op_ptr, block_name);

		auto &var = set<SPIRVariable>(op_var, op_ptr, StorageClassOutput);
		if (per_primitive)
			set_decoration(op_var, DecorationPerPrimitiveEXT);
		set_name(op_var, instance_name);
		execution.interface_variables.push_back(var.self);

		return op_var;
	};

	if (id_per_vertex == 0 && need_per_vertex)
		id_per_vertex = generate_block("gl_MeshPerVertexEXT", "gl_MeshVerticesEXT", false);
	if (id_per_primitive == 0 && need_per_primitive)
		id_per_primitive = generate_block("gl_MeshPerPrimitiveEXT", "gl_MeshPrimitivesEXT", true);

	unordered_set<uint32_t> processed_func_ids;
	analyze_meshlet_writes(ir.default_entry_point, id_per_vertex, id_per_primitive, processed_func_ids);
}